

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

void Abc_ConvertZddToSop_rec
               (DdManager *dd,DdNode *zCover,char *pSop,int nFanins,Vec_Str_t *vCube,int fPhase,
               int *pnCubes)

{
  uint uVar1;
  char *pCube;
  DdNode *pDStack_50;
  int Index;
  DdNode *zC2;
  DdNode *zC1;
  DdNode *zC0;
  Vec_Str_t *pVStack_30;
  int fPhase_local;
  Vec_Str_t *vCube_local;
  char *pcStack_20;
  int nFanins_local;
  char *pSop_local;
  DdNode *zCover_local;
  DdManager *dd_local;
  
  if (zCover != dd->zero) {
    zC0._4_4_ = fPhase;
    pVStack_30 = vCube;
    vCube_local._4_4_ = nFanins;
    pcStack_20 = pSop;
    pSop_local = (char *)zCover;
    zCover_local = &dd->sentinel;
    if (zCover == dd->one) {
      sprintf(pSop + *pnCubes * (nFanins + 3),"%s %d\n",vCube->pArray,(ulong)(uint)fPhase);
      *pnCubes = *pnCubes + 1;
    }
    else {
      uVar1 = zCover->index >> 1;
      if (nFanins <= (int)uVar1) {
        __assert_fail("Index < nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                      ,0x1e0,
                      "void Abc_ConvertZddToSop_rec(DdManager *, DdNode *, char *, int, Vec_Str_t *, int, int *)"
                     );
      }
      extraDecomposeCover(dd,zCover,&zC1,&zC2,&stack0xffffffffffffffb0);
      pVStack_30->pArray[(int)uVar1] = '0';
      Abc_ConvertZddToSop_rec
                ((DdManager *)zCover_local,zC1,pcStack_20,vCube_local._4_4_,pVStack_30,zC0._4_4_,
                 pnCubes);
      pVStack_30->pArray[(int)uVar1] = '1';
      Abc_ConvertZddToSop_rec
                ((DdManager *)zCover_local,zC2,pcStack_20,vCube_local._4_4_,pVStack_30,zC0._4_4_,
                 pnCubes);
      pVStack_30->pArray[(int)uVar1] = '-';
      Abc_ConvertZddToSop_rec
                ((DdManager *)zCover_local,pDStack_50,pcStack_20,vCube_local._4_4_,pVStack_30,
                 zC0._4_4_,pnCubes);
    }
  }
  return;
}

Assistant:

void Abc_ConvertZddToSop_rec( DdManager * dd, DdNode * zCover, char * pSop, int nFanins, Vec_Str_t * vCube, int fPhase, int * pnCubes )
{
    DdNode * zC0, * zC1, * zC2;
    int Index;

    if ( zCover == dd->zero )
        return;
    if ( zCover == dd->one )
    {
        char * pCube;
        pCube = pSop + (*pnCubes) * (nFanins + 3);
        sprintf( pCube, "%s %d\n", vCube->pArray, fPhase );
        (*pnCubes)++;
        return;
    }
    Index = zCover->index/2;
    assert( Index < nFanins );
    extraDecomposeCover( dd, zCover, &zC0, &zC1, &zC2 );
    vCube->pArray[Index] = '0';
    Abc_ConvertZddToSop_rec( dd, zC0, pSop, nFanins, vCube, fPhase, pnCubes );
    vCube->pArray[Index] = '1';
    Abc_ConvertZddToSop_rec( dd, zC1, pSop, nFanins, vCube, fPhase, pnCubes );
    vCube->pArray[Index] = '-';
    Abc_ConvertZddToSop_rec( dd, zC2, pSop, nFanins, vCube, fPhase, pnCubes );
}